

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

bool __thiscall bloaty::dwarf::LocationList::NextEntry(LocationList *this)

{
  uint8_t uVar1;
  unsigned_short uVar2;
  uint64_t uVar3;
  uint64_t bytes;
  string_view *in_RDI;
  uint16_t length;
  uint64_t end;
  uint64_t start;
  string_view *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd8;
  bool local_1;
  
  uVar3 = CompilationUnitSizes::ReadAddress
                    ((CompilationUnitSizes *)in_RDI,in_stack_ffffffffffffffc8);
  bytes = CompilationUnitSizes::ReadAddress
                    ((CompilationUnitSizes *)in_RDI,in_stack_ffffffffffffffc8);
  if ((uVar3 == 0) && (bytes == 0)) {
    local_1 = false;
  }
  else {
    if ((uVar3 != 0xffffffffffffffff) &&
       ((uVar3 != 0xffffffff ||
        (uVar1 = CompilationUnitSizes::address_size((CompilationUnitSizes *)in_RDI), uVar1 != '\x04'
        )))) {
      uVar2 = ReadFixed<unsigned_short,2ul>(in_RDI);
      SkipBytes(bytes,(string_view *)CONCAT26(uVar2,in_stack_ffffffffffffffd8));
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool LocationList::NextEntry() {
  uint64_t start, end;
  start = sizes_.ReadAddress(&remaining_);
  end = sizes_.ReadAddress(&remaining_);
  if (start == 0 && end == 0) {
    return false;
  } else if (start == UINT64_MAX ||
             (start == UINT32_MAX && sizes_.address_size() == 4)) {
    // Base address selection, nothing more to do.
  } else {
    // Need to skip the location description.
    uint16_t length = ReadFixed<uint16_t>(&remaining_);
    SkipBytes(length, &remaining_);
  }
  return true;
}